

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O0

HighsDebugStatus
debugHighsSolution(string *message,HighsOptions *options,HighsModel *model,HighsSolution *solution,
                  HighsBasis *basis)

{
  HighsDebugStatus HVar1;
  string *in_RDI;
  bool check_model_status_and_highs_info;
  HighsInfo dummy_highs_info;
  HighsModelStatus dummy_model_status;
  bool in_stack_0000015f;
  HighsBasis *in_stack_00000160;
  HighsSolution *in_stack_00000168;
  HighsHessian *in_stack_00000170;
  HighsLp *in_stack_00000178;
  HighsOptions *in_stack_00000180;
  string *in_stack_00000188;
  HighsModelStatus in_stack_000001a0;
  HighsInfo *in_stack_000001a8;
  HighsInfo *this;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  string local_118 [35];
  undefined1 local_f5;
  HighsInfo local_e8;
  HighsModelStatus local_2c [11];
  
  HighsInfo::HighsInfo((HighsInfo *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  resetModelStatusAndHighsInfo(local_2c,&local_e8);
  local_f5 = 0;
  std::__cxx11::string::string(local_118,in_RDI);
  this = &local_e8;
  HVar1 = debugHighsSolution(in_stack_00000188,in_stack_00000180,in_stack_00000178,in_stack_00000170
                             ,in_stack_00000168,in_stack_00000160,in_stack_000001a0,
                             in_stack_000001a8,in_stack_0000015f);
  std::__cxx11::string::~string(local_118);
  HighsInfo::~HighsInfo(this);
  return HVar1;
}

Assistant:

HighsDebugStatus debugHighsSolution(const string message,
                                    const HighsOptions& options,
                                    const HighsModel& model,
                                    const HighsSolution& solution,
                                    const HighsBasis& basis) {
  // Non-trivially expensive analysis of a solution to a model
  //
  // Called to report on KKT errors after solving a model when only
  // the solution (possibly only primal) and (possibly) basis are
  // known
  //
  // Set up a HighsModelStatus and HighsInfo just to
  // complete the parameter list.By setting
  // check_model_status_and_highs_info to be false they aren't
  // used.
  HighsModelStatus dummy_model_status;
  HighsInfo dummy_highs_info;
  // Call resetModelStatusAndSolutionParams to side-step compiler
  // warning.
  resetModelStatusAndHighsInfo(dummy_model_status, dummy_highs_info);
  const bool check_model_status_and_highs_info = false;
  return debugHighsSolution(
      message, options, model.lp_, model.hessian_, solution, basis,
      dummy_model_status, dummy_highs_info, check_model_status_and_highs_info);
}